

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_attr * lyd_insert_attr(lyd_node *parent,lys_module *mod,char *name,char *value)

{
  lys_node *plVar1;
  lys_module *plVar2;
  lys_ext_instance_complex *ext;
  lyd_attr *plVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *name_00;
  lyd_attr *attr;
  undefined8 *puVar7;
  lys_type *plVar8;
  lyd_attr *plVar9;
  LY_ERR no;
  uint uVar10;
  ly_ctx *ctx;
  
  if ((name == (char *)0x0 || parent == (lyd_node *)0x0) || value == (char *)0x0) {
    pcVar6 = "Invalid arguments (%s()).";
    no = LY_EINVAL;
    ctx = (ly_ctx *)0x0;
    goto LAB_00166c2d;
  }
  plVar1 = parent->schema;
  plVar2 = plVar1->module;
  ctx = plVar2->ctx;
  pcVar6 = strchr(name,0x3a);
  if (pcVar6 == (char *)0x0) {
    if (mod == (lys_module *)0x0) {
      iVar4 = strcmp(name,"type");
      if (((iVar4 == 0) || (iVar4 = strcmp(name,"select"), iVar4 == 0)) &&
         (iVar4 = strcmp(plVar1->name,"filter"), iVar4 == 0)) {
        mod = ly_ctx_get_module(ctx,"ietf-netconf",(char *)0x0,1);
        if (mod == (lys_module *)0x0) {
          pcVar6 = "Attribute prefix does not match any implemented schema in the context.";
          goto LAB_00166c48;
        }
      }
      else {
        mod = plVar2;
        if ((plVar2->field_0x40 & 1) != 0) {
          mod = (lys_module *)plVar2->data;
        }
      }
    }
LAB_00166ad9:
    iVar4 = -1;
    do {
      uVar10 = iVar4 + 1;
      if (((mod->ext_size <= uVar10) ||
          (iVar4 = lys_ext_instance_presence
                             ((*(ctx->models).list)->extensions,mod->ext + uVar10,
                              mod->ext_size - (char)uVar10), iVar4 == -1)) ||
         (iVar4 = iVar4 + uVar10, iVar4 == -1)) {
        pcVar6 = "Attribute does not match any annotation instance definition.";
        goto LAB_00166c48;
      }
      iVar5 = ly_strequal_(mod->ext[iVar4]->arg_value,name);
    } while (iVar5 == 0);
    attr = (lyd_attr *)calloc(1,0x38);
    if (attr != (lyd_attr *)0x0) {
      attr->parent = parent;
      ext = (lys_ext_instance_complex *)mod->ext[iVar4];
      attr->annotation = ext;
      pcVar6 = lydict_insert(ctx,name,0);
      attr->name = pcVar6;
      pcVar6 = lydict_insert(ctx,value,0);
      attr->value_str = pcVar6;
      puVar7 = (undefined8 *)lys_ext_complex_get_substmt(LY_STMT_TYPE,ext,(lyext_substmt **)0x0);
      plVar8 = lyp_parse_value((lys_type *)*puVar7,&attr->value_str,(lyxml_elem *)0x0,
                               (lyd_node_leaf_list *)0x0,attr,(lys_module *)0x0,1,0,0);
      if (plVar8 == (lys_type *)0x0) {
        lyd_free_attr(ctx,(lyd_node *)0x0,attr,0);
        return (lyd_attr *)0x0;
      }
      plVar3 = parent->attr;
      if (parent->attr != (lyd_attr *)0x0) {
        do {
          plVar9 = plVar3;
          plVar3 = plVar9->next;
        } while (plVar3 != (lyd_attr *)0x0);
        plVar9->next = attr;
        return attr;
      }
      parent->attr = attr;
      return attr;
    }
  }
  else {
    name_00 = strndup(name,(long)pcVar6 - (long)name);
    if (name_00 != (char *)0x0) {
      mod = ly_ctx_get_module(ctx,name_00,(char *)0x0,1);
      free(name_00);
      if (mod == (lys_module *)0x0) {
        pcVar6 = "Attribute prefix does not match any implemented schema in the context.";
LAB_00166c48:
        ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar6);
        return (lyd_attr *)0x0;
      }
      name = pcVar6 + 1;
      goto LAB_00166ad9;
    }
  }
  pcVar6 = "Memory allocation failed (%s()).";
  no = LY_EMEM;
LAB_00166c2d:
  ly_log(ctx,LY_LLERR,no,pcVar6,"lyd_insert_attr");
  return (lyd_attr *)0x0;
}

Assistant:

lyd_attr *
lyd_insert_attr(struct lyd_node *parent, const struct lys_module *mod, const char *name, const char *value)
{
    struct lyd_attr *a, *iter;
    struct ly_ctx *ctx;
    const struct lys_module *module;
    const char *p;
    char *aux;
    int pos, i;

    if (!parent || !name || !value) {
        LOGARG;
        return NULL;
    }
    ctx = parent->schema->module->ctx;

    if ((p = strchr(name, ':'))) {
        /* search for the namespace */
        aux = strndup(name, p - name);
        if (!aux) {
            LOGMEM(ctx);
            return NULL;
        }
        module = ly_ctx_get_module(ctx, aux, NULL, 1);
        free(aux);
        name = p + 1;

        if (!module) {
            /* module not found */
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else if (mod) {
        module = mod;
    } else if (!mod && (!strcmp(name, "type") || !strcmp(name, "select")) && !strcmp(parent->schema->name, "filter")) {
        /* special case of inserting unqualified filter attributes "type" and "select" */
        module = ly_ctx_get_module(ctx, "ietf-netconf", NULL, 1);
        if (!module) {
            LOGERR(ctx, LY_EINVAL, "Attribute prefix does not match any implemented schema in the context.");
            return NULL;
        }
    } else {
        /* no prefix -> module is the same as for the parent */
        module = lyd_node_module(parent);
    }

    pos = -1;
    do {
        if ((unsigned int)(pos + 1) < module->ext_size) {
            i = lys_ext_instance_presence(&ctx->models.list[0]->extensions[0],
                                          &module->ext[pos + 1], module->ext_size - (pos + 1));
            pos = (i == -1) ? -1 : pos + 1 + i;
        } else {
            pos = -1;
        }
        if (pos == -1) {
            LOGERR(ctx, LY_EINVAL, "Attribute does not match any annotation instance definition.");
            return NULL;
        }
    } while (!ly_strequal(module->ext[pos]->arg_value, name, 0));

    a = calloc(1, sizeof *a);
    LY_CHECK_ERR_RETURN(!a, LOGMEM(ctx), NULL);
    a->parent = parent;
    a->next = NULL;
    a->annotation = (struct lys_ext_instance_complex *)module->ext[pos];
    a->name = lydict_insert(ctx, name, 0);
    a->value_str = lydict_insert(ctx, value, 0);
    if (!lyp_parse_value(*((struct lys_type **)lys_ext_complex_get_substmt(LY_STMT_TYPE, a->annotation, NULL)),
                         &a->value_str, NULL, NULL, a, NULL, 1, 0, 0)) {
        lyd_free_attr(ctx, NULL, a, 0);
        return NULL;
    }

    if (!parent->attr) {
        parent->attr = a;
    } else {
        for (iter = parent->attr; iter->next; iter = iter->next);
        iter->next = a;
    }

    return a;
}